

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.c
# Opt level: O1

uint crc_calc(uchar *data,int len)

{
  uint uVar1;
  long lVar2;
  
  if (0 < len) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 << 8 ^ crc_table[(uint)data[lVar2] ^ uVar1 >> 0x10 & 0xff];
      lVar2 = lVar2 + 1;
    } while (len != (int)lVar2);
    return uVar1 & 0xffffff;
  }
  return 0;
}

Assistant:

unsigned int
crc_calc(unsigned char *data, int len)
{
	unsigned int crc = 0;
	int i;

	for (i = 0; i < len; i++)
		crc = (crc << 8) ^ crc_table[(unsigned char)(crc >> 16) ^ *data++];

	/* ok */
	return (crc & 0xFFFFFF);
}